

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int tlp_cpld_data_length(tlp_cpl_hdr *ch)

{
  byte bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long in_RDI;
  undefined4 local_4;
  
  uVar2 = ntohs(*(uint16_t *)(in_RDI + 2));
  bVar1 = *(byte *)(in_RDI + 0xb);
  uVar3 = ntohs(*(uint16_t *)(in_RDI + 6));
  if ((uVar2 & 0x3ff) == (int)((bVar1 & 3) + (uVar3 & 0xfff) + 3) >> 2) {
    uVar2 = ntohs(*(uint16_t *)(in_RDI + 6));
    local_4 = uVar2 & 0xfff;
  }
  else {
    uVar2 = ntohs(*(uint16_t *)(in_RDI + 2));
    local_4 = (uVar2 & 0x3ff) * 4 - (*(byte *)(in_RDI + 0xb) & 3);
  }
  return local_4;
}

Assistant:

int tlp_cpld_data_length(struct tlp_cpl_hdr *ch)
{
	/* if this is last CplD, byte count is actual byte length */
	if (tlp_length(ch->tlp.falen) ==
	    ((ch->lowaddr & 0x3) + tlp_cpl_bcnt(ch->stcnt) + 3) >> 2)
		return tlp_cpl_bcnt(ch->stcnt);

	/* if not, length - padding due to 4DW alignment */
	return (tlp_length(ch->tlp.falen) << 2) - (ch->lowaddr & 0x3);
}